

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

_Bool ImGui::BeginPopupModal(char *name,_Bool *p_open,ImGuiWindowFlags flags)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImGuiWindow *this;
  ImVec2 IVar5;
  ImGuiContext_conflict1 *pIVar6;
  ImGuiContext_conflict1 *pIVar7;
  _Bool _Var8;
  ImGuiID id;
  ImGuiViewportP *pIVar9;
  
  pIVar6 = GImGui;
  this = (ImGuiWindow *)GImGui->CurrentWindow;
  id = ImGuiWindow::GetID(this,name,(char *)0x0);
  _Var8 = IsPopupOpen(id,0);
  if (_Var8) {
    if (((pIVar6->NextWindowData).Flags & 1) == 0) {
      if (this->WasActive == true) {
        pIVar9 = this->Viewport;
      }
      else {
        pIVar9 = (ImGuiViewportP *)GetMainViewport();
      }
      pIVar7 = GImGui;
      fVar1 = (pIVar9->_ImGuiViewport).Size.x;
      fVar2 = (pIVar9->_ImGuiViewport).Pos.x;
      fVar3 = (pIVar9->_ImGuiViewport).Size.y;
      fVar4 = (pIVar9->_ImGuiViewport).Pos.y;
      (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 1;
      IVar5.y = fVar3 * 0.5 + fVar4;
      IVar5.x = fVar1 * 0.5 + fVar2;
      (pIVar7->NextWindowData).PosVal = IVar5;
      (pIVar7->NextWindowData).PosPivotVal.x = 0.5;
      (pIVar7->NextWindowData).PosPivotVal.y = 0.5;
      (pIVar7->NextWindowData).PosCond = 4;
      (pIVar7->NextWindowData).PosUndock = true;
    }
    _Var8 = Begin(name,p_open,flags | 0xc200020);
    if (_Var8) {
      if (p_open == (_Bool *)0x0) {
        return true;
      }
      if (*p_open != false) {
        return true;
      }
      EndPopup();
      if (_Var8) {
        ClosePopupToLevel((pIVar6->BeginPopupStack).Size,true);
      }
    }
    else {
      EndPopup();
    }
  }
  else {
    (pIVar6->NextWindowData).Flags = 0;
  }
  return false;
}

Assistant:

bool ImGui::BeginPopupModal(const char* name, bool* p_open, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiID id = window->GetID(name);
    if (!IsPopupOpen(id, ImGuiPopupFlags_None))
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
        return false;
    }

    // Center modal windows by default for increased visibility
    // (this won't really last as settings will kick in, and is mostly for backward compatibility. user may do the same themselves)
    // FIXME: Should test for (PosCond & window->SetWindowPosAllowFlags) with the upcoming window.
    if ((g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasPos) == 0)
    {
        const ImGuiViewport* viewport = window->WasActive ? window->Viewport : GetMainViewport(); // FIXME-VIEWPORT: What may be our reference viewport?
        SetNextWindowPos(viewport->GetCenter(), ImGuiCond_FirstUseEver, ImVec2(0.5f, 0.5f));
    }

    flags |= ImGuiWindowFlags_Popup | ImGuiWindowFlags_Modal | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoDocking;
    const bool is_open = Begin(name, p_open, flags);
    if (!is_open || (p_open && !*p_open)) // NB: is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    {
        EndPopup();
        if (is_open)
            ClosePopupToLevel(g.BeginPopupStack.Size, true);
        return false;
    }
    return is_open;
}